

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator * __thiscall
QMultiHash<QString,_QCss::StyleRule>::emplace_helper<QCss::StyleRule>
          (QMultiHash<QString,_QCss::StyleRule> *this,QString *key,StyleRule *args)

{
  long lVar1;
  piter it;
  StyleRule *in_RCX;
  Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *in_RDX;
  MultiNode<QString,_QCss::StyleRule> *in_RSI;
  iterator *in_RDI;
  long in_FS_OFFSET;
  InsertionResult result;
  MultiNode<QString,_QCss::StyleRule> *n;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n = in_RSI;
  QHashPrivate::Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_>::findOrInsert<QString>
            (in_RDX,(QString *)in_RCX);
  QHashPrivate::iterator<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_>::node
            ((iterator<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)in_RCX);
  QHashPrivate::MultiNode<QString,_QCss::StyleRule>::createInPlace<QCss::StyleRule>
            (n,(QString *)in_RDX,in_RCX);
  (in_RSI->key).d.ptr = (char16_t *)((long)(in_RSI->key).d.ptr + 1);
  it.bucket = (size_t)in_RDX;
  it.d = (Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *)in_RCX;
  iterator::iterator((iterator *)in_RSI,it,(Chain **)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&...args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->insertMulti(std::forward<Args>(args)...);
        ++m_size;
        return iterator(result.it);
    }